

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void __thiscall
duckdb::ModeFunction<duckdb::ModeStandard<long>_>::
UpdateWindowState<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>,_long>::Left
          (UpdateWindowState<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>,_long> *this,
          idx_t begin,idx_t end)

{
  bool bVar1;
  idx_t local_20;
  
  while (begin < end) {
    local_20 = begin;
    bVar1 = ModeIncluded<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>_>::operator()
                      (this->included,&local_20);
    if (bVar1) {
      ModeState<long,_duckdb::ModeStandard<long>_>::ModeRm(this->state,local_20);
    }
    begin = local_20 + 1;
  }
  return;
}

Assistant:

inline void Left(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					state.ModeRm(begin);
				}
			}
		}